

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_uint64(uint64_t *number,uint16_t tlv_id,dlep_session *session,
                      dlep_parser_value *value)

{
  __uint64_t _Var1;
  uint8_t *ptr;
  uint64_t tmp;
  dlep_parser_value *value_local;
  dlep_session *session_local;
  uint16_t tlv_id_local;
  uint64_t *number_local;
  
  tmp = (uint64_t)value;
  if ((value == (dlep_parser_value *)0x0) &&
     (tmp = (uint64_t)dlep_session_get_tlv_value(session,tlv_id),
     (dlep_parser_value *)tmp == (dlep_parser_value *)0x0)) {
    number_local._4_4_ = -1;
  }
  else {
    _Var1 = __bswap_64(*(__uint64_t *)((session->parser).tlv_ptr + *(ushort *)(tmp + 4)));
    *number = _Var1;
    number_local._4_4_ = 0;
  }
  return number_local._4_4_;
}

Assistant:

int
dlep_reader_uint64(uint64_t *number, uint16_t tlv_id, struct dlep_session *session, struct dlep_parser_value *value) {
  uint64_t tmp;
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, tlv_id);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  memcpy(&tmp, ptr, sizeof(tmp));
  *number = be64toh(tmp);
  return 0;
}